

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::extend<8ul,signed_char,short,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  Type *other;
  int32_t iVar1;
  long lVar2;
  Literal *this_00;
  undefined1 local_280 [8];
  LaneArray<8UL_*_2> lanes;
  LaneArray<8UL> result;
  
  getLanes<signed_char,16>((LaneArray<16> *)local_280,this,vec);
  memset(&lanes._M_elems[0xf].type,0,0xc0);
  other = &result._M_elems[7].type;
  for (lVar2 = 0; lVar2 != 0xc0; lVar2 = lVar2 + 0x18) {
    iVar1 = Literal::geti32((Literal *)(local_280 + lVar2));
    result._M_elems[7].type.id._0_4_ = (int)(char)iVar1;
    this_00 = (Literal *)((long)result._M_elems + lVar2 + -8);
    if (this_00 != (Literal *)other) {
      Literal::~Literal(this_00);
      Literal::Literal(this_00,(Literal *)other);
    }
    Literal::~Literal((Literal *)other);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)&lanes._M_elems[0xf].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&lanes._M_elems[0xf].type);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_280);
  return __return_storage_ptr__;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}